

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool container_iterator_read_into_uint64
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint64_t high48,
                uint64_t *buf,uint32_t count,uint32_t *consumed,uint16_t *value_out)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint16_t uVar11;
  uint uVar12;
  uint uVar13;
  uint32_t i_1;
  uint uVar14;
  ulong uVar15;
  
  *consumed = 0;
  if (count == 0) {
    return false;
  }
  if (typecode == '\x01') {
    uVar10 = (long)it->index / 0x40 & 0xffffffff;
    bVar4 = (byte)((long)it->index % 0x40);
    lVar2 = *(long *)((long)c + 8);
    uVar7 = (*(ulong *)(lVar2 + uVar10 * 8) >> (bVar4 & 0x3f)) << (bVar4 & 0x3f);
    uVar5 = 0;
    do {
      uVar8 = (uint)uVar10;
      uVar13 = uVar8 << 6;
      while ((uVar7 != 0 && (uVar5 < count))) {
        lVar3 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        *buf = ((uint)lVar3 | uVar13) | high48;
        uVar7 = uVar7 & uVar7 - 1;
        buf = buf + 1;
        uVar5 = uVar5 + 1;
        *consumed = uVar5;
      }
      iVar6 = (uVar8 & 0x3ff) << 6;
      for (uVar15 = (ulong)(uVar8 + 1); (uVar7 == 0 && ((uint)uVar15 < 0x400)); uVar15 = uVar15 + 1)
      {
        uVar7 = *(ulong *)(lVar2 + uVar15 * 8);
        uVar13 = uVar13 + 0x40;
        iVar6 = iVar6 + 0x40;
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      if (uVar7 == 0) {
        return false;
      }
    } while (uVar5 < count);
    lVar2 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    it->index = uVar13 + (int)lVar2;
    uVar11 = (short)iVar6 + (short)lVar2;
  }
  else {
    if (typecode != '\x02') {
      lVar2 = *(long *)((long)c + 8);
      uVar8 = (uint)*value_out;
      uVar5 = 0;
      do {
        uVar12 = (uint)*(ushort *)(lVar2 + 2 + (long)it->index * 4) +
                 (uint)*(ushort *)(lVar2 + (long)it->index * 4);
        uVar8 = uVar8 & 0xffff;
        uVar14 = (uVar12 - uVar8) + 1;
        uVar13 = count - uVar5;
        if (uVar14 < count - uVar5) {
          uVar13 = uVar14;
        }
        for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
          buf[uVar7] = uVar8 + (int)uVar7 | high48;
        }
        uVar8 = uVar8 + uVar13;
        *value_out = (uint16_t)uVar8;
        uVar5 = uVar5 + uVar13;
        *consumed = uVar5;
        if (((uint16_t)uVar8 == 0) || (uVar12 < (uVar8 & 0xffff))) {
          iVar6 = it->index;
          iVar9 = iVar6 + 1;
          it->index = iVar9;
          if (*c <= iVar9) {
            return false;
          }
          uVar1 = *(ushort *)(lVar2 + 4 + (long)iVar6 * 4);
          uVar8 = (uint)uVar1;
          *value_out = uVar1;
          uVar5 = *consumed;
        }
        buf = buf + uVar13;
      } while (uVar5 < count);
      return true;
    }
    iVar6 = it->index;
    uVar5 = *c - iVar6;
    uVar7 = (ulong)uVar5;
    if (count <= uVar5) {
      uVar7 = (ulong)count;
    }
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      buf[uVar10] = *(ushort *)(*(long *)((long)c + 8) + (ulong)(uint)(iVar6 + (int)uVar10) * 2) |
                    high48;
    }
    *consumed = (uint32_t)uVar7;
    iVar6 = (uint32_t)uVar7 + it->index;
    it->index = iVar6;
    if (*c <= iVar6) {
      return false;
    }
    uVar11 = *(uint16_t *)(*(long *)((long)c + 8) + (long)iVar6 * 2);
  }
  *value_out = uVar11;
  return true;
}

Assistant:

bool container_iterator_read_into_uint64(const container_t *c, uint8_t typecode,
                                         roaring_container_iterator_t *it,
                                         uint64_t high48, uint64_t *buf,
                                         uint32_t count, uint32_t *consumed,
                                         uint16_t *value_out) {
    *consumed = 0;
    if (count == 0) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            do {
                // Read set bits.
                while (word != 0 && *consumed < count) {
                    *buf = high48 |
                           (wordindex * 64 + roaring_trailing_zeroes(word));
                    word = word & (word - 1);
                    buf++;
                    (*consumed)++;
                }
                // Skip unset bits.
                while (word == 0 &&
                       wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
                    wordindex++;
                    word = bc->words[wordindex];
                }
            } while (word != 0 && *consumed < count);

            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value_out = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            uint32_t num_values =
                minimum_uint32(ac->cardinality - it->index, count);
            for (uint32_t i = 0; i < num_values; i++) {
                buf[i] = high48 | ac->array[it->index + i];
            }
            *consumed += num_values;
            it->index += num_values;
            if (it->index < ac->cardinality) {
                *value_out = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            do {
                uint32_t largest_run_value =
                    rc->runs[it->index].value + rc->runs[it->index].length;
                uint32_t num_values = minimum_uint32(
                    largest_run_value - *value_out + 1, count - *consumed);
                for (uint32_t i = 0; i < num_values; i++) {
                    buf[i] = high48 | (*value_out + i);
                }
                *value_out += num_values;
                buf += num_values;
                *consumed += num_values;

                // We check for `value == 0` because `it->value += num_values`
                // can overflow when `value == UINT16_MAX`, and `count >
                // length`. In this case `value` will overflow to 0.
                if (*value_out > largest_run_value || *value_out == 0) {
                    it->index++;
                    if (it->index < rc->n_runs) {
                        *value_out = rc->runs[it->index].value;
                    } else {
                        return false;
                    }
                }
            } while (*consumed < count);
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return 0;
    }
}